

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context_strand.hpp
# Opt level: O2

void __thiscall asio::io_context::strand::strand(strand *this,io_context *io_context)

{
  strand_service *this_00;
  
  this_00 = use_service<asio::detail::strand_service>(io_context);
  this->service_ = this_00;
  detail::strand_service::construct(this_00,&this->impl_);
  return;
}

Assistant:

explicit strand(asio::io_context& io_context)
    : service_(asio::use_service<
        asio::detail::strand_service>(io_context))
  {
    service_.construct(impl_);
  }